

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

int uv_timer_start(uv_timer_t *handle,uv_timer_cb cb,uint64_t timeout,uint64_t repeat)

{
  void **ha;
  uint *puVar1;
  anon_struct_16_2_d918446b_for_timer_heap *heap;
  uv_loop_t *puVar2;
  heap_node *hb;
  anon_struct_16_2_d918446b_for_timer_heap *paVar3;
  uint uVar4;
  uint64_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  anon_struct_16_2_d918446b_for_timer_heap *paVar9;
  anon_struct_16_2_d918446b_for_timer_heap *paVar10;
  
  if (cb == (uv_timer_cb)0x0) {
    return -0x16;
  }
  if ((handle->flags & 4) != 0) {
    uv_timer_stop(handle);
  }
  puVar2 = handle->loop;
  uVar5 = 0xffffffffffffffff;
  if (!CARRY8(timeout,puVar2->time)) {
    uVar5 = timeout + puVar2->time;
  }
  handle->timer_cb = cb;
  handle->timeout = uVar5;
  handle->repeat = repeat;
  uVar5 = puVar2->timer_counter;
  puVar2->timer_counter = uVar5 + 1;
  handle->start_id = uVar5;
  ha = handle->heap_node;
  handle->heap_node[0] = (void *)0x0;
  handle->heap_node[1] = (void *)0x0;
  handle->heap_node[2] = (void *)0x0;
  iVar6 = 0;
  uVar7 = 0;
  uVar4 = (puVar2->timer_heap).nelts + 1;
  for (uVar8 = uVar4; 1 < uVar8; uVar8 = uVar8 >> 1) {
    uVar7 = (uVar8 & 1) + uVar7 * 2;
    iVar6 = iVar6 + -1;
  }
  heap = &puVar2->timer_heap;
  paVar3 = heap;
  paVar10 = heap;
  for (; paVar9 = paVar3, iVar6 != 0; iVar6 = iVar6 + 1) {
    uVar8 = uVar7 * 8;
    uVar7 = uVar7 >> 1;
    paVar3 = (anon_struct_16_2_d918446b_for_timer_heap *)((ulong)(uVar8 & 8) + (long)paVar9->min);
    paVar10 = paVar9;
  }
  handle->heap_node[2] = paVar10->min;
  paVar9->min = ha;
  (puVar2->timer_heap).nelts = uVar4;
  while (hb = (heap_node *)handle->heap_node[2], hb != (heap_node *)0x0) {
    iVar6 = timer_less_than((heap_node *)ha,hb);
    if (iVar6 == 0) break;
    heap_node_swap((heap *)heap,hb,(heap_node *)ha);
  }
  uVar7 = handle->flags;
  if (((uVar7 & 4) == 0) && (handle->flags = uVar7 | 4, (uVar7 & 8) != 0)) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 + 1;
  }
  return 0;
}

Assistant:

int uv_timer_start(uv_timer_t* handle,
                   uv_timer_cb cb,
                   uint64_t timeout,
                   uint64_t repeat) {
  uint64_t clamped_timeout;

  if (cb == NULL)
    return UV_EINVAL;

  if (uv__is_active(handle))
    uv_timer_stop(handle);

  clamped_timeout = handle->loop->time + timeout;
  if (clamped_timeout < timeout)
    clamped_timeout = (uint64_t) -1;

  handle->timer_cb = cb;
  handle->timeout = clamped_timeout;
  handle->repeat = repeat;
  /* start_id is the second index to be compared in uv__timer_cmp() */
  handle->start_id = handle->loop->timer_counter++;

  heap_insert(timer_heap(handle->loop),
              (struct heap_node*) &handle->heap_node,
              timer_less_than);
  uv__handle_start(handle);

  return 0;
}